

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O3

void __thiscall nuraft::inmem_log_store::inmem_log_store(inmem_log_store *this)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  log_entry *plVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  mapped_type *pmVar4;
  ptr<buffer> buf;
  log_entry *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  key_type local_40;
  shared_ptr<nuraft::buffer> local_38;
  int local_24;
  
  (this->super_log_store)._vptr_log_store = (_func_int **)&PTR__inmem_log_store_005bdfd0;
  p_Var1 = &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->logs_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->logs_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->logs_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->logs_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->logs_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->start_idx_).super___atomic_base<unsigned_long>._M_i = 1;
  p_Var1 = &(this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  this->raft_server_bwd_pointer_ = (raft_server *)0x0;
  (this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i = 0;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->disk_emul_ea_).status._M_i = idle;
  (this->disk_emul_ea_).cvLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->disk_emul_ea_).cvLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->disk_emul_ea_).cvLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->disk_emul_ea_).cvLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->disk_emul_ea_).cvLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->disk_emul_thread_)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  (this->disk_emul_thread_stop_signal_)._M_base._M_i = false;
  std::condition_variable::condition_variable(&(this->disk_emul_ea_).cv);
  (this->disk_emul_last_durable_index_).super___atomic_base<unsigned_long>._M_i = 0;
  buffer::alloc((buffer *)&local_38,8);
  local_24 = 0;
  local_58 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>&>
            (a_Stack_50,&local_58,(allocator<nuraft::log_entry> *)&local_40,&local_24,&local_38);
  local_40 = 0;
  pmVar4 = std::
           map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
           ::operator[](&this->logs_,&local_40);
  _Var3._M_pi = a_Stack_50[0]._M_pi;
  plVar2 = local_58;
  local_58 = (log_entry *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pmVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  (pmVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = plVar2;
  (pmVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  if (local_38.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

inmem_log_store::inmem_log_store()
    : start_idx_(1)
    , raft_server_bwd_pointer_(nullptr)
    , disk_emul_delay(0)
    , disk_emul_thread_(nullptr)
    , disk_emul_thread_stop_signal_(false)
    , disk_emul_last_durable_index_(0)
{
    // Dummy entry for index 0.
    ptr<buffer> buf = buffer::alloc(sz_ulong);
    logs_[0] = cs_new<log_entry>(0, buf);
}